

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_search.c
# Opt level: O0

ps_lattice_t * fsg_search_lattice(ps_search_t *search)

{
  float fVar1;
  fsg_model_t *fsg_00;
  logmath_t *plVar2;
  int32 iVar3;
  int iVar4;
  s3wid_t sVar5;
  int iVar6;
  ps_lattice_t *dag_00;
  fsg_hist_entry_t *pfVar7;
  fsg_hist_entry_t *pfVar8;
  ps_latnode_t *ppVar9;
  fsg_link_t *pfVar10;
  ps_latnode_t *ppVar11;
  double dVar12;
  char *local_d8;
  char *local_c8;
  char *local_b0;
  int32 fillpen;
  int32 silpen;
  fsg_link_t *link_1;
  fsg_arciter_t *itor2;
  fsg_link_t *link;
  fsg_hist_entry_t *pfh_1;
  int sf_1;
  int32 ascr_1;
  ps_latnode_t *dest;
  ps_latnode_t *src;
  fsg_arciter_t *itor;
  fsg_hist_entry_t *fh_1;
  fsg_hist_entry_t *pfh;
  int sf;
  int32 ascr;
  fsg_hist_entry_t *fh;
  int32 n;
  int32 i;
  ps_lattice_t *dag;
  ps_latnode_t *node;
  fsg_model_t *fsg;
  fsg_search_t *fsgs;
  ps_search_t *search_local;
  
  if ((search->dag == (ps_lattice_t *)0x0) || (search->dag->n_frames != search[1].post)) {
    ps_lattice_free(search->dag);
    search->dag = (ps_lattice_t *)0x0;
    dag_00 = ps_lattice_init_search(search,search[1].post);
    fsg_00 = (fsg_model_t *)search[1].type;
    iVar3 = fsg_history_n_entries((fsg_history_t *)search[1].pls);
    for (fh._4_4_ = 0; fh._4_4_ < iVar3; fh._4_4_ = fh._4_4_ + 1) {
      pfVar7 = fsg_history_entry_get((fsg_history_t *)search[1].pls,fh._4_4_);
      if ((pfVar7->fsglink != (fsg_link_t *)0x0) && (pfVar7->fsglink->wid != -1)) {
        if (pfVar7->pred == 0) {
          pfh._4_4_ = pfVar7->score;
          pfh._0_4_ = 0;
        }
        else {
          pfVar8 = fsg_history_entry_get((fsg_history_t *)search[1].pls,pfVar7->pred);
          pfh._4_4_ = pfVar7->score - pfVar8->score;
          pfh._0_4_ = pfVar8->frame + 1;
        }
        new_node(dag_00,fsg_00,(int)pfh,pfVar7->frame,pfVar7->fsglink->wid,pfVar7->fsglink->to_state
                 ,pfh._4_4_);
      }
    }
    iVar3 = fsg_history_n_entries((fsg_history_t *)search[1].pls);
    for (fh._4_4_ = 0; fh._4_4_ < iVar3; fh._4_4_ = fh._4_4_ + 1) {
      pfVar7 = fsg_history_entry_get((fsg_history_t *)search[1].pls,fh._4_4_);
      if ((pfVar7->fsglink != (fsg_link_t *)0x0) && (pfVar7->fsglink->wid != -1)) {
        if (pfVar7->pred == 0) {
          pfh_1._4_4_ = pfVar7->score;
          pfh_1._0_4_ = 0;
        }
        else {
          pfVar8 = fsg_history_entry_get((fsg_history_t *)search[1].pls,pfVar7->pred);
          pfh_1._0_4_ = pfVar8->frame + 1;
          pfh_1._4_4_ = pfVar7->score - pfVar8->score;
        }
        ppVar9 = find_node(dag_00,fsg_00,(int)pfh_1,pfVar7->fsglink->wid,pfVar7->fsglink->to_state);
        iVar4 = pfVar7->frame + 1;
        for (src = (ps_latnode_t *)fsg_model_arcs(fsg_00,pfVar7->fsglink->to_state);
            src != (ps_latnode_t *)0x0; src = (ps_latnode_t *)fsg_arciter_next((fsg_arciter_t *)src)
            ) {
          pfVar10 = fsg_arciter_get((fsg_arciter_t *)src);
          if (pfVar10->wid < 0) {
            for (link_1 = (fsg_link_t *)fsg_model_arcs(fsg_00,pfVar10->to_state);
                link_1 != (fsg_link_t *)0x0;
                link_1 = (fsg_link_t *)fsg_arciter_next((fsg_arciter_t *)link_1)) {
              pfVar10 = fsg_arciter_get((fsg_arciter_t *)link_1);
              if ((pfVar10->wid != -1) &&
                 (ppVar11 = find_node(dag_00,fsg_00,iVar4,pfVar10->wid,pfVar10->to_state),
                 ppVar11 != (ps_latnode_t *)0x0)) {
                ps_lattice_link(dag_00,ppVar9,ppVar11,pfh_1._4_4_,pfVar7->frame);
              }
            }
          }
          else {
            ppVar11 = find_node(dag_00,fsg_00,iVar4,pfVar10->wid,pfVar10->to_state);
            if (ppVar11 != (ps_latnode_t *)0x0) {
              ps_lattice_link(dag_00,ppVar9,ppVar11,pfh_1._4_4_,pfVar7->frame);
            }
          }
        }
      }
    }
    ppVar9 = find_start_node((fsg_search_t *)search,dag_00);
    dag_00->start = ppVar9;
    if (ppVar9 == (ps_latnode_t *)0x0) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
              ,0x5f0,"Failed to find the start node\n");
    }
    else {
      ppVar9 = find_end_node((fsg_search_t *)search,dag_00);
      dag_00->end = ppVar9;
      if (ppVar9 != (ps_latnode_t *)0x0) {
        if (dag_00->start->wid == -1) {
          local_b0 = "(NULL)";
        }
        else {
          local_b0 = fsg_00->vocab[dag_00->start->wid];
        }
        if (dag_00->end->wid == -1) {
          local_c8 = "(NULL)";
        }
        else {
          local_c8 = fsg_00->vocab[dag_00->end->wid];
        }
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
                ,0x5fb,"lattice start node %s.%d end node %s.%d\n",local_b0,
                (ulong)(uint)dag_00->start->sf,local_c8,dag_00->end->sf);
        for (dag = (ps_lattice_t *)dag_00->nodes; dag != (ps_lattice_t *)0x0;
            dag = *(ps_lattice_t **)&dag->n_frames) {
          if (*(int *)&dag->field_0x4 == -1) {
            local_d8 = "(NULL)";
          }
          else {
            local_d8 = fsg_00->vocab[*(int *)&dag->field_0x4];
          }
          sVar5 = dict_wordid(dag_00->search->dict,local_d8);
          *(s3wid_t *)&dag->field_0x4 = sVar5;
          *(s3wid_t *)&dag->lmath = dag_00->search->dict->word[*(int *)&dag->field_0x4].basewid;
        }
        mark_reachable(dag_00,dag_00->end);
        ps_lattice_delete_unreachable(dag_00);
        plVar2 = fsg_00->lmath;
        dVar12 = ps_config_float(search->config,"silprob");
        iVar4 = logmath_log(plVar2,(float64)dVar12);
        fVar1 = (float)fsg_00->lw;
        plVar2 = fsg_00->lmath;
        dVar12 = ps_config_float(search->config,"fillprob");
        iVar6 = logmath_log(plVar2,(float64)dVar12);
        ps_lattice_penalize_fillers
                  (dag_00,(int)((float)iVar4 * fVar1) >> 10,
                   (int)((float)iVar6 * (float)fsg_00->lw) >> 10);
        search->dag = dag_00;
        return dag_00;
      }
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_search.c"
              ,0x5f4,"Failed to find the end node\n");
    }
    ps_lattice_free(dag_00);
    search_local = (ps_search_t *)0x0;
  }
  else {
    search_local = (ps_search_t *)search->dag;
  }
  return (ps_lattice_t *)search_local;
}

Assistant:

static ps_lattice_t *
fsg_search_lattice(ps_search_t *search)
{
    fsg_search_t *fsgs;
    fsg_model_t *fsg;
    ps_latnode_t *node;
    ps_lattice_t *dag;
    int32 i, n;

    fsgs = (fsg_search_t *)search;

    /* Check to see if a lattice has previously been created over the
     * same number of frames, and reuse it if so. */
    if (search->dag && search->dag->n_frames == fsgs->frame)
        return search->dag;

    /* Nope, create a new one. */
    ps_lattice_free(search->dag);
    search->dag = NULL;
    dag = ps_lattice_init_search(search, fsgs->frame);
    fsg = fsgs->fsg;

    /*
     * Each history table entry represents a link in the word graph.
     * The set of nodes is determined by the number of unique
     * (word,start-frame) pairs in the history table.  So we will
     * first find all those nodes.
     */
    n = fsg_history_n_entries(fsgs->history);
    for (i = 0; i < n; ++i) {
        fsg_hist_entry_t *fh = fsg_history_entry_get(fsgs->history, i);
        int32 ascr;
        int sf;

        /* Skip null transitions. */
        if (fh->fsglink == NULL || fh->fsglink->wid == -1)
            continue;

        /* Find the start node of this link. */
        if (fh->pred) {
            fsg_hist_entry_t *pfh = fsg_history_entry_get(fsgs->history, fh->pred);
            /* FIXME: We include the transition score in the lattice
             * link score.  This is because of the practical
             * difficulty of obtaining it separately in bestpath or
             * forward-backward search, and because it is essentially
             * a unigram probability, so there is no need to treat it
             * separately from the acoustic score.  However, it's not
             * clear that this will actually yield correct results.*/
            ascr = fh->score - pfh->score;
            sf = pfh->frame + 1;
        }
        else {
            ascr = fh->score;
            sf = 0;
        }

        /*
         * Note that although scores are tied to links rather than
         * nodes, it's possible that there are no links out of the
         * destination node, and thus we need to preserve its score in
         * case it turns out to be utterance-final.
         */
        new_node(dag, fsg, sf, fh->frame, fh->fsglink->wid, fsg_link_to_state(fh->fsglink), ascr);
    }

    /*
     * Now, we will create links only to nodes that actually exist.
     */
    n = fsg_history_n_entries(fsgs->history);
    for (i = 0; i < n; ++i) {
        fsg_hist_entry_t *fh = fsg_history_entry_get(fsgs->history, i);
        fsg_arciter_t *itor;
        ps_latnode_t *src, *dest;
        int32 ascr;
        int sf;

        /* Skip null transitions. */
        if (fh->fsglink == NULL || fh->fsglink->wid == -1)
            continue;

        /* Find the start node of this link and calculate its link score. */
        if (fh->pred) {
            fsg_hist_entry_t *pfh = fsg_history_entry_get(fsgs->history, fh->pred);
            sf = pfh->frame + 1;
            ascr = fh->score - pfh->score;
        }
        else {
            ascr = fh->score;
            sf = 0;
        }
        src = find_node(dag, fsg, sf, fh->fsglink->wid, fsg_link_to_state(fh->fsglink));
        sf = fh->frame + 1;

        for (itor = fsg_model_arcs(fsg, fsg_link_to_state(fh->fsglink));
             itor; itor = fsg_arciter_next(itor)) {
            fsg_link_t *link = fsg_arciter_get(itor);
            
            /* FIXME: Need to figure out what to do about tag transitions. */
            if (link->wid >= 0) {
                /*
                 * For each non-epsilon link following this one, look for a
                 * matching node in the lattice and link to it.
                 */
                if ((dest = find_node(dag, fsg, sf, link->wid, fsg_link_to_state(link))) != NULL)
            	    ps_lattice_link(dag, src, dest, ascr, fh->frame);
            }
            else {
                /*
                 * Transitive closure on nulls has already been done, so we
                 * just need to look one link forward from them.
                 */
                fsg_arciter_t *itor2;
                
                /* Add all non-null links out of j. */
                for (itor2 = fsg_model_arcs(fsg, fsg_link_to_state(link));
                     itor2; itor2 = fsg_arciter_next(itor2)) {
                    fsg_link_t *link = fsg_arciter_get(itor2);

                    if (link->wid == -1)
                        continue;
                    
                    if ((dest = find_node(dag, fsg, sf, link->wid, fsg_link_to_state(link))) != NULL) {
                        ps_lattice_link(dag, src, dest, ascr, fh->frame);
                    }
                }
            }
        }
    }


    /* Figure out which nodes are the start and end nodes. */
    if ((dag->start = find_start_node(fsgs, dag)) == NULL) {
	E_WARN("Failed to find the start node\n");
        goto error_out;
    }
    if ((dag->end = find_end_node(fsgs, dag)) == NULL) {
	E_WARN("Failed to find the end node\n");
        goto error_out;
    }


    E_INFO("lattice start node %s.%d end node %s.%d\n",
           fsg_model_word_str(fsg, dag->start->wid), dag->start->sf,
           fsg_model_word_str(fsg, dag->end->wid), dag->end->sf);
    /* FIXME: Need to calculate final_node_ascr here. */

    /*
     * Convert word IDs from FSG to dictionary.
     */
    for (node = dag->nodes; node; node = node->next) {
        node->wid = dict_wordid(dag->search->dict,
                                fsg_model_word_str(fsg, node->wid));
        node->basewid = dict_basewid(dag->search->dict, node->wid);
    }

    /*
     * Now we are done, because the links in the graph are uniquely
     * defined by the history table.  However we should remove any
     * nodes which are not reachable from the end node of the FSG.
     * Everything is reachable from the start node by definition.
     */
    mark_reachable(dag, dag->end);

    ps_lattice_delete_unreachable(dag);
    {
        int32 silpen, fillpen;

        silpen = (int32)(logmath_log(fsg->lmath,
                                     ps_config_float(ps_search_config(fsgs), "silprob"))
                         * fsg->lw)
            >> SENSCR_SHIFT;
        fillpen = (int32)(logmath_log(fsg->lmath,
                                      ps_config_float(ps_search_config(fsgs), "fillprob"))
                          * fsg->lw)
            >> SENSCR_SHIFT;
	
	ps_lattice_penalize_fillers(dag, silpen, fillpen);
    }
    search->dag = dag;

    return dag;


error_out:
    ps_lattice_free(dag);
    return NULL;

}